

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dofhandler.cc
# Opt level: O3

size_type __thiscall
lf::assemble::DynamicFEDofHandler::NumInteriorDofs(DynamicFEDofHandler *this,Entity *entity)

{
  element_type *peVar1;
  int iVar2;
  dim_t dVar3;
  uint uVar4;
  
  iVar2 = (*entity->_vptr_Entity[4])(entity);
  dVar3 = base::internal::DimensionImpl((RefElType)iVar2);
  peVar1 = (this->mesh_p_).super___shared_ptr<const_lf::mesh::Mesh,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar4 = (*peVar1->_vptr_Mesh[5])(peVar1,entity);
  return *(size_type *)
          (*(long *)(&(this->num_int_dofs_).field_0x0 + (ulong)(2 - dVar3) * 0x18) +
          (ulong)uVar4 * 4);
}

Assistant:

size_type DynamicFEDofHandler::NumInteriorDofs(
    const lf::mesh::Entity &entity) const {
  const lf::base::RefEl ref_el_type = entity.RefEl();
  const dim_t codim = 2 - ref_el_type.Dimension();
  const glb_idx_t entity_index = mesh_p_->Index(entity);
  const size_type no_loc_dofs = num_int_dofs_[codim][entity_index];
  return no_loc_dofs;
}